

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minisnsf.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  _Alloc_hider __nptr;
  int iVar2;
  off_t i;
  mapped_type *pmVar3;
  ulong uVar4;
  byte bVar5;
  bool bVar6;
  long lVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  off_t offset;
  ulong uVar12;
  bool bVar13;
  size_t sStack_2200;
  allocator local_21ed;
  int local_21ec;
  int *local_21e8;
  ulong local_21e0;
  ulong local_21d8;
  char *endptr;
  char *local_21c8;
  long local_21c0;
  long local_21b8;
  string bytestr;
  uint8_t exe [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2068;
  string hexstring;
  char libname [4096];
  
  if (argc == 1) {
LAB_001055fd:
    usage(*argv);
    return 1;
  }
  endptr = (char *)0x0;
  lVar7 = 0;
  local_21c8 = (char *)0x0;
  while ((lVar7 + 1 < (long)argc && (pcVar10 = argv[lVar7 + 1], *pcVar10 == '-'))) {
    iVar2 = strcmp(pcVar10,"--help");
    if (iVar2 == 0) goto LAB_001055fd;
    iVar2 = strcmp(pcVar10,"--psfby");
    if ((iVar2 != 0) && (iVar2 = strcmp(pcVar10,"--snsfby"), iVar2 != 0)) {
      pcVar9 = "Error: Unknown option \"%s\"\n";
      goto LAB_00105952;
    }
    if (argc <= (int)(lVar7 + 1) + 1) {
      pcVar9 = "Error: Too few arguments for \"%s\"\n";
      goto LAB_00105952;
    }
    local_21c8 = argv[lVar7 + 2];
    lVar7 = lVar7 + 2;
  }
  if (argc + -5 == (int)lVar7) {
    pcVar10 = argv[lVar7 + 1];
    sprintf(libname,"%s.snsflib");
    local_21c0 = strtol(argv[lVar7 + 2],&endptr,0x10);
    if (((*endptr == '\0') && (local_21e8 = __errno_location(), *local_21e8 != 0x22)) &&
       (-1 < local_21c0)) {
      local_21b8 = strtol(argv[lVar7 + 4],&endptr,10);
      if (((*endptr == '\0') && (*local_21e8 != 0x22)) && (-1 < local_21b8)) {
        memset(exe,0,0x108);
        pcVar9 = argv[lVar7 + 3];
        if (*pcVar9 == '=') {
          std::__cxx11::string::string((string *)&hexstring,pcVar9 + 1,(allocator *)&bytestr);
          if ((hexstring._M_string_length & 1) == 0) {
            local_21e0 = hexstring._M_string_length >> 1;
            if (hexstring._M_string_length < 0x202) {
              local_21d8 = 0;
              uVar11 = 0;
              bVar6 = false;
              local_21ec = 0;
              uVar12 = 0;
              do {
                bVar13 = local_21e0 == uVar12;
                if (bVar13) break;
                std::__cxx11::string::substr((ulong)&bytestr,(ulong)&hexstring);
                __nptr = bytestr._M_dataplus;
                iVar2 = strcasecmp(bytestr._M_dataplus._M_p,"NN");
                if (iVar2 == 0) {
                  bVar1 = true;
                  if (uVar11 == 0) {
                    uVar11 = 1;
                    local_21d8 = uVar12;
                  }
                  else {
                    if (!bVar6) {
                      fwrite("Error: Multiple number field\n",0x1d,1,_stderr);
                      goto LAB_00105897;
                    }
                    uVar11 = uVar11 + 1;
                  }
                  bVar6 = true;
                }
                else {
                  lVar7 = strtol(__nptr._M_p,&endptr,0x10);
                  if ((*endptr == '\0') && (*local_21e8 != 0x22)) {
                    exe[uVar12 + 8] = (uint8_t)lVar7;
                    bVar1 = true;
                    bVar6 = false;
                  }
                  else {
                    fprintf(_stderr,"Error: Number format error \"%s\"\n",bytestr._M_dataplus._M_p);
LAB_00105897:
                    bVar1 = false;
                    bVar6 = false;
                    local_21ec = 1;
                  }
                }
                std::__cxx11::string::~string((string *)&bytestr);
                uVar12 = uVar12 + 1;
              } while (bVar1);
            }
            else {
              fwrite("Error: Output size error\n",0x19,1,_stderr);
              local_21ec = 1;
              bVar13 = false;
              local_21d8 = 0;
              uVar11 = 0;
            }
          }
          else {
            fwrite("Error: Hex string length error\n",0x1f,1,_stderr);
            local_21ec = 1;
            bVar13 = false;
            local_21d8 = 0;
            uVar11 = 0;
            local_21e0 = 0;
          }
          std::__cxx11::string::~string((string *)&hexstring);
          if (!bVar13) {
            return local_21ec;
          }
        }
        else {
          uVar11 = strtol(pcVar9,&endptr,10);
          if (((*endptr != '\0') || (*local_21e8 == 0x22)) || ((long)uVar11 < 0)) {
            pcVar10 = argv[lVar7 + 3];
            goto LAB_0010594b;
          }
          local_21d8 = 0;
          local_21e0 = uVar11;
        }
        uVar12 = local_21d8;
        if (uVar11 < 5) {
          exe[0] = (uint8_t)local_21c0;
          exe[1] = (uint8_t)((ulong)local_21c0 >> 8);
          exe[2] = (uint8_t)((ulong)local_21c0 >> 0x10);
          exe[3] = (uint8_t)((ulong)local_21c0 >> 0x18);
          exe[4] = (uint8_t)local_21e0;
          exe[5] = (uint8_t)(local_21e0 >> 8);
          exe[6] = (uint8_t)(local_21e0 >> 0x10);
          exe[7] = (uint8_t)(local_21e0 >> 0x18);
          local_21e0 = CONCAT44(local_21e0._4_4_,(int)local_21e0 + 8);
          local_21e8 = (int *)((ulong)local_21e8 & 0xffffffff00000000);
          for (uVar8 = 0; uVar8 != (uint)local_21b8; uVar8 = uVar8 + 1) {
            bytestr._M_string_length._0_4_ = 0;
            bytestr.field_2._M_allocated_capacity = 0;
            bytestr.field_2._8_8_ = &bytestr._M_string_length;
            std::__cxx11::string::string((string *)&hexstring,"_lib",&local_21ed);
            pmVar3 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&bytestr,&hexstring);
            std::__cxx11::string::assign((char *)pmVar3);
            std::__cxx11::string::~string((string *)&hexstring);
            if ((local_21c8 != (char *)0x0) && (*local_21c8 != '\0')) {
              std::__cxx11::string::string((string *)&hexstring,"snsfby",&local_21ed);
              pmVar3 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&bytestr,&hexstring);
              std::__cxx11::string::assign((char *)pmVar3);
              std::__cxx11::string::~string((string *)&hexstring);
            }
            sprintf((char *)&hexstring,"%s-%04d.minisnsf",pcVar10);
            if (-1 < (long)local_21d8) {
              bVar5 = 0;
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                exe[uVar4 + uVar12 + 8] = (uint8_t)(uVar8 >> (bVar5 & 0x1f));
                bVar5 = bVar5 + 8;
              }
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::_Rb_tree(&local_2068,
                       (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&bytestr);
            bVar13 = exe2snsf((char *)&hexstring,exe,(uint32_t)local_21e0,
                              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&local_2068);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree(&local_2068);
            if (bVar13) {
              printf("Created %s\n",&hexstring);
            }
            else {
              printf("Error: Unable to create %s\n",&hexstring);
              local_21e8 = (int *)CONCAT44(local_21e8._4_4_,(int)local_21e8 + 1);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&bytestr);
          }
          return (uint)((int)local_21e8 != 0);
        }
        pcVar10 = "Error: Output number size error\n";
        sStack_2200 = 0x20;
        goto LAB_00105bff;
      }
      pcVar10 = argv[lVar7 + 4];
    }
    else {
      pcVar10 = argv[lVar7 + 2];
    }
LAB_0010594b:
    pcVar9 = "Error: Number format error \"%s\"\n";
LAB_00105952:
    fprintf(_stderr,pcVar9,pcVar10);
  }
  else {
    pcVar10 = "Error: Too few/more arguments\n";
    sStack_2200 = 0x1e;
LAB_00105bff:
    fwrite(pcVar10,sStack_2200,1,_stderr);
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc == 1) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	long longval;
	char *endptr = NULL;

	char *psfby = NULL;

	int argi = 1;
	while (argi < argc && argv[argi][0] == '-') {
		if (strcmp(argv[argi], "--help") == 0) {
			usage(argv[0]);
			return EXIT_FAILURE;
		}
		else if (strcmp(argv[argi], "--psfby") == 0 || strcmp(argv[argi], "--snsfby") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			psfby = argv[argi + 1];
			argi++;
		}
		else {
			fprintf(stderr, "Error: Unknown option \"%s\"\n", argv[argi]);
			return EXIT_FAILURE;
		}
		argi++;
	}

	int argnum = argc - argi;
	if (argnum != 4) {
		fprintf(stderr, "Error: Too few/more arguments\n");
		return EXIT_FAILURE;
	}

	char * snsf_basename = argv[argi];

	char libname[PATH_MAX];
	sprintf(libname, "%s.snsflib", snsf_basename);

	longval = strtol(argv[argi + 1], &endptr, 16);
	if (*endptr != '\0' || errno == ERANGE || longval < 0) {
		fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 1]);
		return EXIT_FAILURE;
	}
	uint32_t load_offset = (uint32_t)longval;

	longval = strtol(argv[argi + 3], &endptr, 10);
	if (*endptr != '\0' || errno == ERANGE || longval < 0) {
		fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 3]);
		return EXIT_FAILURE;
	}
	uint32_t count = (uint32_t)longval;

	uint8_t exe[SNSF_EXE_HEADER_SIZE + 256];
	memset(exe, 0, SNSF_EXE_HEADER_SIZE + 256);

	off_t offset_of_num = 0;
	size_t size_of_num = 0;
	size_t romsize = 0;
	if (argv[argi + 2][0] == '=') {
		std::string hexstring(&argv[argi + 2][1]);

		if (hexstring.length() % 2 != 0) {
			fprintf(stderr, "Error: Hex string length error\n");
			return EXIT_FAILURE;
		}
		romsize = hexstring.length() / 2;
		if (romsize > 256) {
			fprintf(stderr, "Error: Output size error\n");
			return EXIT_FAILURE;
		}

		bool in_number = false;
		uint8_t * hex = &exe[SNSF_EXE_HEADER_SIZE];
		for (off_t offset = 0; offset < (off_t)romsize; offset++) {
			std::string bytestr = hexstring.substr(offset * 2, 2);

			if (strcasecmp(bytestr.c_str(), "NN") == 0) {
				if (size_of_num == 0) {
					offset_of_num = offset;
					size_of_num = 1;
					in_number = true;
				}
				else {
					if (!in_number) {
						fprintf(stderr, "Error: Multiple number field\n");
						return EXIT_FAILURE;
					}
					size_of_num++;
				}
			}
			else {
				in_number = false;

				longval = strtol(bytestr.c_str(), &endptr, 16);
				if (*endptr != '\0' || errno == ERANGE) {
					fprintf(stderr, "Error: Number format error \"%s\"\n", bytestr.c_str());
					return EXIT_FAILURE;
				}

				hex[offset] = (uint8_t)longval;
			}
		}
	} else {
		longval = strtol(argv[argi + 2], &endptr, 10);
		if (*endptr != '\0' || errno == ERANGE || longval < 0) {
			fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 2]);
			return EXIT_FAILURE;
		}
		romsize = size_of_num = (size_t)longval;
	}

	if (size_of_num > 4) {
		fprintf(stderr, "Error: Output number size error\n");
		return EXIT_FAILURE;
	}

	writeInt(&exe[0], load_offset);
	writeInt(&exe[4], (uint32_t)romsize);

	int num_error = 0;
	for (uint32_t num = 0; num < count; num++) {
		std::map<std::string, std::string> tags;
		tags["_lib"] = libname;

		if (psfby != NULL && strcmp(psfby, "") != 0) {
			tags["snsfby"] = psfby;
		}

		char snsf_path[PATH_MAX];
		sprintf(snsf_path, "%s-%04d.minisnsf", snsf_basename, num);

		// patch exe
		if (offset_of_num >= 0) {
			for (off_t i = 0; i < (off_t)size_of_num; i++) {
				exe[SNSF_EXE_HEADER_SIZE + offset_of_num + i] = (num >> (8 * i)) & 0xff;
			}
		}

		if (exe2snsf(snsf_path, exe, SNSF_EXE_HEADER_SIZE + (uint32_t)romsize, tags)) {
			printf("Created %s\n", snsf_path);
		}
		else {
			printf("Error: Unable to create %s\n", snsf_path);
			num_error++;
		}
	}

	return (num_error == 0) ? EXIT_SUCCESS : EXIT_FAILURE;
}